

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O3

ZDD zdd_set_union(ZDD set1,ZDD set2)

{
  uint8_t *puVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  ZDD ZVar5;
  long lVar6;
  long lVar7;
  
  if (set1 == set2 || set2 == 0x8000000000000000) {
    return set1;
  }
  lVar6 = (set1 & 0xffffffffff) * 0x10;
  lVar7 = (set2 & 0xffffffffff) * 0x10;
  puVar1 = nodes->data;
  uVar3 = (uint)(*(ulong *)(puVar1 + lVar6 + 8) >> 0x20);
  if (*(ulong *)(puVar1 + lVar6 + 8) >> 0x28 < *(ulong *)(puVar1 + lVar7 + 8) >> 0x28) {
    uVar2 = *(ulong *)(puVar1 + lVar6);
  }
  else {
    uVar4 = (uint)(*(ulong *)(puVar1 + lVar7 + 8) >> 0x20);
    if (uVar4 >> 8 < uVar3 >> 8) {
      ZVar5 = zdd_set_union(set1,*(ulong *)(puVar1 + lVar7) & 0x800000ffffffffff);
      uVar3 = uVar4;
      goto joined_r0x00121225;
    }
    uVar2 = *(ulong *)(puVar1 + lVar6);
    set2 = *(ulong *)(puVar1 + lVar7) & 0x800000ffffffffff;
  }
  ZVar5 = zdd_set_union(uVar2 & 0x800000ffffffffff,set2);
joined_r0x00121225:
  if (ZVar5 == 0) {
    return 0;
  }
  ZVar5 = _zdd_makenode(uVar3 >> 8,ZVar5,ZVar5);
  return ZVar5;
}

Assistant:

ZDD
zdd_set_union(ZDD set1, ZDD set2)
{
    if (set1 == zdd_true) return set2;
    if (set2 == zdd_true) return set1;
    if (set1 == set2) return set1;

    zddnode_t set1_node = ZDD_GETNODE(set1);
    zddnode_t set2_node = ZDD_GETNODE(set2);
    uint32_t set1_var = zddnode_getvariable(set1_node);
    uint32_t set2_var = zddnode_getvariable(set2_node);

    if (set1_var < set2_var) {
        ZDD sub = zdd_set_union(zddnode_high(set1, set1_node), set2);
        return zdd_makenode(set1_var, sub, sub);
    } else if (set1_var > set2_var) {
        ZDD sub = zdd_set_union(set1, zddnode_high(set2, set2_node));
        return zdd_makenode(set2_var, sub, sub);
    } else {
        ZDD sub = zdd_set_union(zddnode_high(set1, set1_node), zddnode_high(set2, set2_node));
        return zdd_makenode(set1_var, sub, sub);
    }
}